

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  VectorType vector_type_p;
  bool bVar1;
  dtime_tz_t *count_00;
  Vector *in_RCX;
  ValidityMask *in_RDX;
  undefined8 in_RDI;
  VectorType in_R8B;
  Vector *unaff_retaddr;
  ValidityMask *result_validity;
  dtime_tz_t *result_data;
  interval_t *rdata;
  dtime_tz_t *ldata;
  bool in_stack_0000008f;
  ValidityMask *in_stack_00000090;
  idx_t in_stack_00000098;
  dtime_tz_t *in_stack_000000a0;
  interval_t *in_stack_000000a8;
  dtime_tz_t *in_stack_000000b0;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  vector_type_p = in_R8B & FSST_VECTOR;
  count_00 = FlatVector::GetData<duckdb::dtime_tz_t>((Vector *)0x12f173b);
  FlatVector::GetData<duckdb::interval_t>((Vector *)0x12f174a);
  bVar1 = ConstantVector::IsNull((Vector *)0x12f1759);
  if (bVar1) {
    Vector::SetVectorType(in_RCX,vector_type_p);
    ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  }
  else {
    Vector::SetVectorType(in_RCX,vector_type_p);
    FlatVector::GetData<duckdb::dtime_tz_t>((Vector *)0x12f1798);
    FlatVector::Validity((Vector *)0x12f17a7);
    bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar1) {
      FlatVector::Validity((Vector *)0x12f17cb);
      TemplatedValidityMask<unsigned_long>::Copy
                ((TemplatedValidityMask<unsigned_long> *)in_RCX,
                 (TemplatedValidityMask<unsigned_long> *)
                 CONCAT17(vector_type_p,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x12f17f2);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,in_RDX);
    }
    ExecuteFlatLoop<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000090,in_stack_0000008f);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}